

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# euler.c
# Opt level: O3

void glmc_euler_angles(vec4 *m,float *dest)

{
  float fVar1;
  float __x;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar2 = m[2][0];
  if (1.0 <= fVar2) {
    fVar3 = atan2f((*m)[1],m[1][1]);
    fVar4 = 0.0;
    fVar2 = 1.5707964;
  }
  else if (fVar2 <= -1.0) {
    fVar3 = atan2f((*m)[1],m[1][1]);
    fVar3 = -fVar3;
    fVar4 = 0.0;
    fVar2 = -1.5707964;
  }
  else {
    fVar4 = (*m)[0];
    fVar1 = m[1][0];
    fVar3 = m[2][1];
    __x = m[2][2];
    fVar2 = asinf(fVar2);
    fVar3 = atan2f(-fVar3,__x);
    fVar4 = atan2f(-fVar1,fVar4);
  }
  *dest = fVar3;
  dest[1] = fVar2;
  dest[2] = fVar4;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_euler_angles(mat4 m, vec3 dest) {
  glm_euler_angles(m, dest);
}